

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_ct_tv(CTState *cts,CType *d,uint8_t *dp,TValue *o,CTInfo flags)

{
  TValue *pTVar1;
  uint uVar2;
  uint *puVar3;
  CTState *cts_00;
  void *pvVar4;
  ulong *in_RCX;
  undefined8 *in_RDX;
  TValue *in_RSI;
  CType *in_RDI;
  uint in_R8D;
  void *p;
  GCudata *ud;
  CTSize sz;
  CType *dc;
  CType *cct;
  CTSize ofs;
  GCstr *str;
  CTypeID did;
  uint8_t *sp;
  uint8_t tmpbool;
  void *tmpptr;
  CType *s;
  CTypeID sid;
  CType *ct;
  uint32_t *segmap;
  uint64_t seg;
  uint64_t u;
  GCtab *in_stack_fffffffffffffde8;
  uint8_t *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  TValue *in_stack_fffffffffffffe00;
  GCfunc *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  CTInfo in_stack_fffffffffffffe14;
  CTState *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 *local_1c8;
  CType *local_1c0;
  uint local_1b8;
  uint local_1b4;
  undefined8 *local_1a8;
  TValue *local_1a0;
  TValue *in_stack_fffffffffffffe70;
  CType *in_stack_fffffffffffffe78;
  CType *in_stack_fffffffffffffe80;
  CType *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  CType *local_120;
  TValue *local_d8;
  
  local_1b8 = 0x11;
  local_1a0 = in_RSI;
  if (*(uint *)((long)in_RCX + 4) < 0xfffeffff) {
    local_1b8 = 0xe;
    local_1b4 = in_R8D | 2;
  }
  else {
    local_1b4 = in_R8D;
    if (*(uint *)((long)in_RCX + 4) == 0xfffffff5) {
      local_1b8 = (uint)*(ushort *)((ulong)(uint)*in_RCX + 6);
      puVar3 = (uint *)(*(long *)in_RDI + (ulong)local_1b8 * 0x10);
      if ((*puVar3 & 0xf0800000) == 0x20800000) {
        local_1b8 = *puVar3 & 0xffff;
      }
      for (local_120 = (CType *)(*(long *)in_RDI + (ulong)local_1b8 * 0x10);
          local_120->info >> 0x1c == 8;
          local_120 = (CType *)(*(long *)in_RDI + (ulong)(local_120->info & 0xffff) * 0x10)) {
      }
      local_1c0 = local_120;
      if (local_120->info >> 0x1c != 6) {
        if (local_120->info >> 0x1c == 5) {
          in_stack_fffffffffffffe94 = local_120->info & 0xffff;
          local_1c0 = (CType *)(*(long *)in_RDI + (ulong)in_stack_fffffffffffffe94 * 0x10);
          in_stack_fffffffffffffe80 = local_120;
          in_stack_fffffffffffffe88 = in_RDI;
        }
        goto LAB_00173f39;
      }
      uVar2 = (uint)((long)in_RSI - *(long *)in_RDI >> 4);
      local_1b8 = lj_ctype_intern((CTState *)
                                  CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                                  (CTInfo)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                                  (CTSize)in_stack_fffffffffffffdf0);
      local_1a0 = (TValue *)(*(long *)in_RDI + (ulong)uVar2 * 0x10);
    }
    else if (*(uint *)((long)in_RCX + 4) == 0xfffffffb) {
      cts_00 = (CTState *)(ulong)(uint)*in_RCX;
      if ((in_RSI->u32).lo >> 0x1c == 5) {
        in_stack_fffffffffffffe08 =
             (GCfunc *)
             lj_ctype_getfieldq(cts_00,(CType *)CONCAT44(in_stack_fffffffffffffe14,
                                                         in_stack_fffffffffffffe10),
                                (GCstr *)&in_stack_fffffffffffffe08->c,
                                (CTSize *)&in_stack_fffffffffffffe00->u64,
                                (CTInfo *)
                                CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        if ((in_stack_fffffffffffffe08 == (GCfunc *)0x0) ||
           ((in_stack_fffffffffffffe08->c).nextgc.gcptr32 >> 0x1c != 0xb)) {
LAB_00173eb9:
          cconv_err_convtv((CTState *)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                           (CType *)&in_stack_fffffffffffffe08->c,in_stack_fffffffffffffe00,
                           in_stack_fffffffffffffdfc);
        }
        local_1b8 = (in_stack_fffffffffffffe08->c).nextgc.gcptr32 & 0xffff;
      }
      else {
        local_d8 = in_RSI;
        if (((in_RSI->u32).lo & 0xfc000000) == 0x30000000) {
          do {
            in_stack_fffffffffffffe00 =
                 (TValue *)(*(long *)in_RDI + (ulong)((local_d8->u32).lo & 0xffff) * 0x10);
            local_d8 = in_stack_fffffffffffffe00;
          } while ((in_stack_fffffffffffffe00->u32).lo >> 0x1c == 8);
          in_stack_fffffffffffffdfc = cts_00->sizetab + 1;
          if ((((in_stack_fffffffffffffe00->u32).lo & 0xfc000000) == 0) &&
             ((in_stack_fffffffffffffe00->field_2).it == 1)) {
            if (((in_RSI->field_2).it != 0) && ((in_RSI->field_2).it < in_stack_fffffffffffffdfc)) {
              in_stack_fffffffffffffdfc = (in_RSI->field_2).it;
            }
            memcpy(in_RDX,&cts_00->L,(ulong)in_stack_fffffffffffffdfc);
            return;
          }
          goto LAB_00173eb9;
        }
        local_1b8 = 0x14;
        local_1b4 = in_R8D | 2;
      }
    }
    else {
      if (*(uint *)((long)in_RCX + 4) == 0xfffffff4) {
        if ((in_RSI->u32).lo >> 0x1c == 3) {
          cconv_array_tab((CTState *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
                          (CType *)&local_1c8,
                          (uint8_t *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                          (GCtab *)in_stack_fffffffffffffe18,in_stack_fffffffffffffe14);
          return;
        }
        if ((in_RSI->u32).lo >> 0x1c == 1) {
          cconv_struct_tab((CTState *)&in_stack_fffffffffffffe00->field_2,
                           (CType *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                           in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0);
          return;
        }
        goto LAB_00173eb9;
      }
      if ((*(uint *)((long)in_RCX + 4) == 0xfffffffe) || (*(uint *)((long)in_RCX + 4) == 0xfffffffd)
         ) {
        local_1b8 = 3;
      }
      else if (*(uint *)((long)in_RCX + 4) == 0xffffffff) {
        local_1c8 = (undefined8 *)0x0;
        local_1b4 = in_R8D | 2;
      }
      else if (*(uint *)((long)in_RCX + 4) == 0xfffffff3) {
        local_1c8 = (undefined8 *)((ulong)(uint)*in_RCX + 0x18);
        if (*(char *)((ulong)(uint)*in_RCX + 6) == '\x01') {
          local_1c8 = (undefined8 *)*local_1c8;
        }
      }
      else {
        if ((int)*(uint *)((long)in_RCX + 4) >> 0xf != -2) {
          if ((*(uint *)((long)in_RCX + 4) == 0xfffffff7) &&
             (local_1a8 = in_RDX,
             pvVar4 = lj_ccallback_new(in_stack_fffffffffffffe18,
                                       (CType *)CONCAT44(in_stack_fffffffffffffe14,
                                                         in_stack_fffffffffffffe10),
                                       in_stack_fffffffffffffe08), pvVar4 != (void *)0x0)) {
            *local_1a8 = pvVar4;
            return;
          }
          goto LAB_00173eb9;
        }
        local_1c8 = (undefined8 *)
                    ((ulong)*(uint *)((ulong)*(uint *)(*(long *)&in_RDI[1].sib + 0x88) +
                                     (*in_RCX >> 0x27 & 0xff) * 4) << 0x20 | *in_RCX & 0x7fffffffff)
        ;
      }
    }
  }
  local_1c0 = (CType *)(*(long *)in_RDI + (ulong)local_1b8 * 0x10);
LAB_00173f39:
  pTVar1 = local_1a0;
  if ((local_1a0->u32).lo >> 0x1c == 5) {
    pTVar1 = (TValue *)(*(long *)in_RDI + (ulong)((local_1a0->u32).lo & 0xffff) * 0x10);
    in_stack_fffffffffffffe70 = local_1a0;
    in_stack_fffffffffffffe78 = in_RDI;
  }
  local_1a0 = pTVar1;
  lj_cconv_ct_ct((CTState *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 (uint8_t *)in_stack_fffffffffffffe78,(uint8_t *)&in_stack_fffffffffffffe70->u64,
                 (CTInfo)((ulong)in_RDI >> 0x20));
  return;
}

Assistant:

void lj_cconv_ct_tv(CTState *cts, CType *d,
		    uint8_t *dp, TValue *o, CTInfo flags)
{
  CTypeID sid = CTID_P_VOID;
  CType *s;
  void *tmpptr;
  uint8_t tmpbool, *sp = (uint8_t *)&tmpptr;
  if (LJ_LIKELY(tvisint(o))) {
    sp = (uint8_t *)&o->i;
    sid = CTID_INT32;
    flags |= CCF_FROMTV;
  } else if (LJ_LIKELY(tvisnum(o))) {
    sp = (uint8_t *)&o->n;
    sid = CTID_DOUBLE;
    flags |= CCF_FROMTV;
  } else if (tviscdata(o)) {
    sp = cdataptr(cdataV(o));
    sid = cdataV(o)->ctypeid;
    s = ctype_get(cts, sid);
    if (ctype_isref(s->info)) {  /* Resolve reference for value. */
      lj_assertCTS(s->size == CTSIZE_PTR, "ref is not pointer-sized");
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isfunc(s->info)) {
      CTypeID did = ctype_typeid(cts, d);
      sid = lj_ctype_intern(cts, CTINFO(CT_PTR, CTALIGN_PTR|sid), CTSIZE_PTR);
      d = ctype_get(cts, did);  /* cts->tab may have been reallocated. */
    } else {
      if (ctype_isenum(s->info)) s = ctype_child(cts, s);
      goto doconv;
    }
  } else if (tvisstr(o)) {
    GCstr *str = strV(o);
    if (ctype_isenum(d->info)) {  /* Match string against enum constant. */
      CTSize ofs;
      CType *cct = lj_ctype_getfield(cts, d, str, &ofs);
      if (!cct || !ctype_isconstval(cct->info))
	goto err_conv;
      lj_assertCTS(d->size == 4, "only 32 bit enum supported");  /* NYI */
      sp = (uint8_t *)&cct->size;
      sid = ctype_cid(cct->info);
    } else if (ctype_isrefarray(d->info)) {  /* Copy string to array. */
      CType *dc = ctype_rawchild(cts, d);
      CTSize sz = str->len+1;
      if (!ctype_isinteger(dc->info) || dc->size != 1)
	goto err_conv;
      if (d->size != 0 && d->size < sz)
	sz = d->size;
      memcpy(dp, strdata(str), sz);
      return;
    } else {  /* Otherwise pass it as a const char[]. */
      sp = (uint8_t *)strdata(str);
      sid = CTID_A_CCHAR;
      flags |= CCF_FROMTV;
    }
  } else if (tvistab(o)) {
    if (ctype_isarray(d->info)) {
      cconv_array_tab(cts, d, dp, tabV(o), flags);
      return;
    } else if (ctype_isstruct(d->info)) {
      cconv_struct_tab(cts, d, dp, tabV(o), flags);
      return;
    } else {
      goto err_conv;
    }
  } else if (tvisbool(o)) {
    tmpbool = boolV(o);
    sp = &tmpbool;
    sid = CTID_BOOL;
  } else if (tvisnil(o)) {
    tmpptr = (void *)0;
    flags |= CCF_FROMTV;
  } else if (tvisudata(o)) {
    GCudata *ud = udataV(o);
    tmpptr = uddata(ud);
    if (ud->udtype == UDTYPE_IO_FILE)
      tmpptr = *(void **)tmpptr;
  } else if (tvislightud(o)) {
    tmpptr = lightudV(cts->g, o);
  } else if (tvisfunc(o)) {
    void *p = lj_ccallback_new(cts, d, funcV(o));
    if (p) {
      *(void **)dp = p;
      return;
    }
    goto err_conv;
  } else {
  err_conv:
    cconv_err_convtv(cts, d, o, flags);
  }
  s = ctype_get(cts, sid);
doconv:
  if (ctype_isenum(d->info)) d = ctype_child(cts, d);
  lj_cconv_ct_ct(cts, d, s, dp, sp, flags);
}